

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

number_validator<long> __thiscall goodform::sub_form::int64(sub_form *this)

{
  bool bVar1;
  long extraout_RDX;
  undefined8 *in_RSI;
  number_validator<long> nVar2;
  allocator<char> local_61;
  string local_60;
  error_message local_40;
  long local_20;
  int64_t val;
  sub_form *this_local;
  
  this_local = this;
  bVar1 = convert<long>((any *)in_RSI[1],&local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"NOT A int64_t",&local_61);
    error_message::error_message(&local_40,&local_60);
    error_message::operator=((error_message *)*in_RSI,&local_40);
    error_message::~error_message(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  number_validator<long>::number_validator
            ((number_validator<long> *)this,local_20,(error_message *)*in_RSI);
  nVar2.value_ = extraout_RDX;
  nVar2.error_ = (error_message *)this;
  return nVar2;
}

Assistant:

number_validator<std::int64_t> sub_form::int64()
  {
    std::int64_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A int64_t");
    return number_validator<std::int64_t>(val, this->error_);
  }